

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O1

void column_test_common_content_access<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*>>>,std::pair<unsigned_int,unsigned_int>>
               (Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>_>
                *col,set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     *setcont,vector<unsigned_int,_std::allocator<unsigned_int>_> *veccont)

{
  uint uVar1;
  pointer ppEVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  pointer ppEVar6;
  pointer puVar7;
  node_ptr next;
  ulong uVar8;
  uint uVar9;
  Entry entry;
  vector<unsigned_int,_std::allocator<unsigned_int>_> container;
  _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::_Identity<std::pair<unsigned_int,_unsigned_int>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_228;
  _Rb_tree_node_base local_1f8;
  undefined **local_1d8;
  ulong local_1d0;
  shared_count sStack_1c8;
  _Base_ptr local_1c0;
  _Rb_tree_node_base local_1b8;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  size_t local_140;
  size_t local_138;
  size_t *local_130;
  size_t *local_128;
  char *local_120;
  _Base_ptr local_118;
  _Base_ptr local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  
  local_50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_48 = "";
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  local_58 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_50,0x11d);
  get_column_content_via_iterators<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*>>>>
            ((column_content<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>_>
              *)&local_228,col);
  if (local_228._M_impl.super__Rb_tree_header._M_node_count ==
      (setcont->_M_t)._M_impl.super__Rb_tree_header._M_node_count) {
    bVar4 = std::__equal<false>::
            equal<std::_Rb_tree_const_iterator<std::pair<unsigned_int,unsigned_int>>,std::_Rb_tree_const_iterator<std::pair<unsigned_int,unsigned_int>>>
                      ((_Rb_tree_const_iterator<std::pair<unsigned_int,_unsigned_int>_>)
                       local_228._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<std::pair<unsigned_int,_unsigned_int>_>)
                       &local_228._M_impl.super__Rb_tree_header,
                       (setcont->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left);
  }
  else {
    bVar4 = false;
  }
  local_1f8._M_color._0_1_ = bVar4;
  local_1f8._M_parent = (_Base_ptr)0x0;
  local_1f8._M_left = (_Base_ptr)0x0;
  local_1b8._0_8_ = "get_column_content_via_iterators(col) == setcont";
  local_1b8._M_parent = (_Base_ptr)0x202ede;
  local_1d0 = local_1d0 & 0xffffffffffffff00;
  local_1d8 = &PTR__lazy_ostream_00249378;
  sStack_1c8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_68 = "";
  local_1c0 = &local_1b8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)&local_1f8._M_left);
  std::
  _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::_Identity<std::pair<unsigned_int,_unsigned_int>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Rb_tree(&local_228);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x11e);
  uVar9 = (uint)((ulong)((long)(veccont->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(veccont->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_start) >> 2);
  if ((int)uVar9 < 0) {
    ppEVar6 = (col->column_).
              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppEVar6 ==
        (col->column_).
        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      local_1f8._0_8_ = (_Base_ptr)0x0;
      local_1f8._M_parent = (_Base_ptr)0x0;
      local_1f8._M_left = (_Base_ptr)0x0;
      goto LAB_0012a591;
    }
    uVar9 = ppEVar6[-1]->rowIndex_ + 1;
  }
  local_228._M_impl._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1f8,(long)(int)uVar9,
             (value_type_conflict1 *)&local_228,(allocator_type *)&local_1b8);
  ppEVar2 = (col->column_).
            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppEVar6 = (col->column_).
                 super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppEVar6 != ppEVar2;
      ppEVar6 = ppEVar6 + 1) {
    uVar1 = (*ppEVar6)->rowIndex_;
    if (uVar9 <= uVar1) break;
    ((_Rb_tree_color *)local_1f8._0_8_)[uVar1] =
         ((*ppEVar6)->super_Entry_field_element_option).element_;
  }
LAB_0012a591:
  puVar7 = (veccont->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)local_1f8._M_parent - local_1f8._0_8_ ==
      (long)(veccont->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)puVar7) {
    if (local_1f8._M_parent == (_Base_ptr)local_1f8._0_8_) {
      bVar4 = true;
    }
    else {
      iVar5 = bcmp((void *)local_1f8._0_8_,puVar7,(long)local_1f8._M_parent - local_1f8._0_8_);
      bVar4 = iVar5 == 0;
    }
  }
  else {
    bVar4 = false;
  }
  local_1d8 = (undefined **)CONCAT71(local_1d8._1_7_,bVar4);
  local_1d0 = 0;
  sStack_1c8.pi_ = (sp_counted_base *)0x0;
  local_1b8._0_8_ = "col.get_content(veccont.size()) == veccont";
  local_1b8._M_parent = (_Base_ptr)0x202f09;
  local_228._M_impl.super__Rb_tree_header._M_header._M_color =
       local_228._M_impl.super__Rb_tree_header._M_header._M_color & 0xffffff00;
  local_228._M_impl._0_4_ = 0x249378;
  local_228._M_impl._4_4_ = 0;
  local_228._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0x251128;
  local_228._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_98 = "";
  local_228._M_impl.super__Rb_tree_header._M_header._M_left = &local_1b8;
  boost::test_tools::tt_detail::report_assertion(&local_1d8,&local_228,&local_a0,0x11e,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_1c8);
  if ((_Base_ptr)local_1f8._0_8_ != (_Base_ptr)0x0) {
    operator_delete((void *)local_1f8._0_8_,(long)local_1f8._M_left - local_1f8._0_8_);
  }
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_a8 = "";
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b0,0x120);
  local_1f8._M_parent = (_Base_ptr)((ulong)local_1f8._M_parent & 0xffffffffffffff00);
  local_1f8._0_8_ = &PTR__lazy_ostream_00249430;
  local_1f8._M_left = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_1f8._M_right = (_Base_ptr)0x2022e6;
  local_138 = (long)(col->column_).
                    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(col->column_).
                    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3;
  local_128 = &local_138;
  local_140 = (setcont->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  local_1b8._M_color._0_1_ = local_138 == local_140;
  local_130 = &local_140;
  local_1b8._M_parent = (_Base_ptr)0x0;
  local_1b8._M_left = (_Base_ptr)0x0;
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_38 = "";
  local_228._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&local_128;
  local_228._M_impl.super__Rb_tree_header._M_header._M_color =
       local_228._M_impl.super__Rb_tree_header._M_header._M_color & 0xffffff00;
  local_228._M_impl._0_4_ = 0x2493f0;
  local_228._M_impl._4_4_ = 0;
  local_228._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0x251128;
  local_228._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
  local_1c0 = (_Base_ptr)&local_130;
  local_1d0 = local_1d0 & 0xffffffffffffff00;
  local_1d8 = &PTR__lazy_ostream_002493f0;
  sStack_1c8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_1b8,&local_1f8,&local_40,0x120,1,2,2,"col.size()",&local_228,"setcont.size()",
             &local_1d8);
  boost::detail::shared_count::~shared_count((shared_count *)&local_1b8._M_left);
  if ((veccont->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (veccont->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    local_d0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_c8 = "";
    local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x124);
    local_1d8 = (undefined **)
                CONCAT71(local_1d8._1_7_,
                         (col->column_).
                         super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
                         ._M_impl.super__Vector_impl_data._M_start ==
                         (col->column_).
                         super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    local_1d0 = 0;
    sStack_1c8.pi_ = (sp_counted_base *)0x0;
    local_1f8._0_8_ = "col.is_empty()";
    local_1f8._M_parent = (_Base_ptr)0x202f33;
    local_228._M_impl.super__Rb_tree_header._M_header._M_color =
         local_228._M_impl.super__Rb_tree_header._M_header._M_color & 0xffffff00;
    local_228._M_impl._0_4_ = 0x249378;
    local_228._M_impl._4_4_ = 0;
    local_228._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0x251128;
    local_228._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
    local_f0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_e8 = "";
    local_228._M_impl.super__Rb_tree_header._M_header._M_left = &local_1f8;
    boost::test_tools::tt_detail::report_assertion();
  }
  else {
    local_100 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_f8 = "";
    local_110 = (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
    local_108 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x126);
    local_1d8 = (undefined **)
                CONCAT71(local_1d8._1_7_,
                         (col->column_).
                         super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
                         ._M_impl.super__Vector_impl_data._M_start !=
                         (col->column_).
                         super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    local_1d0 = 0;
    sStack_1c8.pi_ = (sp_counted_base *)0x0;
    local_1f8._0_8_ = "!col.is_empty()";
    local_1f8._M_parent = (_Base_ptr)0x202f33;
    local_228._M_impl.super__Rb_tree_header._M_header._M_color =
         local_228._M_impl.super__Rb_tree_header._M_header._M_color & 0xffffff00;
    local_228._M_impl._0_4_ = 0x249378;
    local_228._M_impl._4_4_ = 0;
    local_228._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0x251128;
    local_228._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
    local_120 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_118 = (_Base_ptr)0x202ead;
    local_228._M_impl.super__Rb_tree_header._M_header._M_left = &local_1f8;
    boost::test_tools::tt_detail::report_assertion();
  }
  boost::detail::shared_count::~shared_count(&sStack_1c8);
  puVar7 = (veccont->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((veccont->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar7) {
    uVar9 = 1;
    uVar8 = 0;
    do {
      if (puVar7[uVar8] == 0) {
        local_150 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_148 = "";
        local_160 = &boost::unit_test::basic_cstring<char_const>::null;
        local_158 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_150,0x12a,
                   &local_160);
        local_228._M_impl._0_4_ = 0xffffffff;
        local_228._M_impl._4_4_ = 0;
        local_228._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_228._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        local_228._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0;
        local_228._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
        local_228._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)
             CONCAT44(local_228._M_impl.super__Rb_tree_header._M_header._M_left._4_4_,uVar9 - 1);
        local_1f8._0_8_ = &local_228;
        bVar4 = std::
                binary_search<__gnu_cxx::__normal_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*const*,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*,Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*>>>::is_non_zero(unsigned_int)const::_lambda(Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>const*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>const*)_1_>
                          ((col->column_).
                           super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           (col->column_).
                           super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_1f8);
        lVar3 = CONCAT44(local_228._M_impl.super__Rb_tree_header._M_header._4_4_,
                         local_228._M_impl.super__Rb_tree_header._M_header._M_color);
        if (lVar3 != 0) {
          *(long *)CONCAT44(local_228._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_,
                            local_228._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_) =
               lVar3;
          *(long **)(lVar3 + 8) =
               (long *)CONCAT44(local_228._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_,
                                local_228._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_);
          local_228._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_228._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        }
        local_1d8 = (undefined **)CONCAT71(local_1d8._1_7_,!bVar4);
        local_1d0 = 0;
        sStack_1c8.pi_ = (sp_counted_base *)0x0;
        local_1f8._0_8_ = "!col.is_non_zero(i)";
        local_1f8._M_parent = (_Base_ptr)0x202f47;
        local_228._M_impl.super__Rb_tree_header._M_header._M_color =
             local_228._M_impl.super__Rb_tree_header._M_header._M_color & 0xffffff00;
        local_228._M_impl._0_4_ = 0x249378;
        local_228._M_impl._4_4_ = 0;
        local_228._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0x251128;
        local_228._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
        local_170 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_168 = "";
        local_228._M_impl.super__Rb_tree_header._M_header._M_left = &local_1f8;
        boost::test_tools::tt_detail::report_assertion(&local_1d8,&local_228,&local_170,0x12a,1,0,0)
        ;
      }
      else {
        local_180 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_178 = "";
        local_190 = &boost::unit_test::basic_cstring<char_const>::null;
        local_188 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_180,300,&local_190)
        ;
        local_228._M_impl._0_4_ = 0xffffffff;
        local_228._M_impl._4_4_ = 0;
        local_228._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_228._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        local_228._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0;
        local_228._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
        local_228._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)
             CONCAT44(local_228._M_impl.super__Rb_tree_header._M_header._M_left._4_4_,uVar9 - 1);
        local_1f8._0_8_ = &local_228;
        bVar4 = std::
                binary_search<__gnu_cxx::__normal_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*const*,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*,Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*>>>::is_non_zero(unsigned_int)const::_lambda(Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>const*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>const*)_1_>
                          ((col->column_).
                           super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           (col->column_).
                           super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_1f8);
        lVar3 = CONCAT44(local_228._M_impl.super__Rb_tree_header._M_header._4_4_,
                         local_228._M_impl.super__Rb_tree_header._M_header._M_color);
        if (lVar3 != 0) {
          *(long *)CONCAT44(local_228._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_,
                            local_228._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_) =
               lVar3;
          *(long **)(lVar3 + 8) =
               (long *)CONCAT44(local_228._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_,
                                local_228._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_);
          local_228._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_228._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        }
        local_1d8 = (undefined **)CONCAT71(local_1d8._1_7_,bVar4);
        local_1d0 = 0;
        sStack_1c8.pi_ = (sp_counted_base *)0x0;
        local_1f8._0_8_ = "col.is_non_zero(i)";
        local_1f8._M_parent = (_Base_ptr)0x202f47;
        local_228._M_impl.super__Rb_tree_header._M_header._M_color =
             local_228._M_impl.super__Rb_tree_header._M_header._M_color & 0xffffff00;
        local_228._M_impl._0_4_ = 0x249378;
        local_228._M_impl._4_4_ = 0;
        local_228._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0x251128;
        local_228._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
        local_1b8._M_right = (_Base_ptr)0x202e3a;
        local_198 = "";
        local_228._M_impl.super__Rb_tree_header._M_header._M_left = &local_1f8;
        boost::test_tools::tt_detail::report_assertion
                  (&local_1d8,&local_228,&local_1b8._M_right,300,1,0,0);
      }
      boost::detail::shared_count::~shared_count(&sStack_1c8);
      uVar8 = (ulong)uVar9;
      puVar7 = (veccont->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar9 = uVar9 + 1;
    } while (uVar8 < (ulong)((long)(veccont->
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar7 >> 2));
  }
  return;
}

Assistant:

void column_test_common_content_access(Column& col,
                                       const std::set<entry_type>& setcont,
                                       const std::vector<typename Column::Field_element>& veccont) {
  BOOST_CHECK(get_column_content_via_iterators(col) == setcont);
  BOOST_CHECK(col.get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(col.size(), setcont.size());
  }

  if (veccont.empty())
    BOOST_CHECK(col.is_empty());
  else
    BOOST_CHECK(!col.is_empty());

  for (unsigned int i = 0; i < veccont.size(); ++i) {
    if (veccont[i] == 0u)
      BOOST_CHECK(!col.is_non_zero(i));
    else
      BOOST_CHECK(col.is_non_zero(i));
  }
}